

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddScriptedCommand(cmState *this,string *name,cmCommand *command)

{
  bool bVar1;
  int iVar2;
  cmCommand *pcVar3;
  undefined4 extraout_var;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_cmCommand_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_120;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Self local_e8;
  _Self local_e0;
  iterator pos;
  cmCommand *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_c0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Self local_88;
  _Self local_80;
  iterator pos_1;
  string newName;
  cmCommand *oldCmd;
  string sName;
  cmCommand *command_local;
  string *name_local;
  cmState *this_local;
  
  sName.field_2._8_8_ = command;
  cmsys::SystemTools::LowerCase((string *)&oldCmd,name);
  pcVar3 = GetCommand(this,(string *)&oldCmd);
  if (pcVar3 != (cmCommand *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_1,"_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldCmd);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
         ::find(&this->ScriptedCommands,(key_type *)&pos_1);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
         ::end(&this->ScriptedCommands);
    bVar1 = std::operator!=(&local_80,&local_88);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>
               ::operator->(&local_80);
      if (ppVar4->second != (cmCommand *)0x0) {
        (*ppVar4->second->_vptr_cmCommand[1])();
      }
      local_90 = local_80._M_node;
      local_98 = (_Base_ptr)
                 std::
                 map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                 ::erase_abi_cxx11_((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                                     *)&this->ScriptedCommands,local_80._M_node);
    }
    iVar2 = (*pcVar3->_vptr_cmCommand[6])();
    local_c8 = (cmCommand *)CONCAT44(extraout_var,iVar2);
    std::make_pair<std::__cxx11::string_const&,cmCommand*>
              (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_1
               ,&local_c8);
    _Var5 = std::
            map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
            ::insert<std::pair<std::__cxx11::string,cmCommand*>>
                      ((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                        *)&this->ScriptedCommands,&local_c0);
    pos._M_node = (_Base_ptr)_Var5.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
    ::~pair(&local_c0);
    std::__cxx11::string::~string((string *)&pos_1);
  }
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::find(&this->ScriptedCommands,(key_type *)&oldCmd);
  local_e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::end(&this->ScriptedCommands);
  bVar1 = std::operator!=(&local_e0,&local_e8);
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>
             ::operator->(&local_e0);
    if (ppVar4->second != (cmCommand *)0x0) {
      (*ppVar4->second->_vptr_cmCommand[1])();
    }
    local_f0 = local_e0._M_node;
    local_f8 = (_Base_ptr)
               std::
               map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
               ::erase_abi_cxx11_((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                                   *)&this->ScriptedCommands,local_e0._M_node);
  }
  std::make_pair<std::__cxx11::string&,cmCommand*&>
            (&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oldCmd
             ,(cmCommand **)((long)&sName.field_2 + 8));
  std::
  map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
  ::insert<std::pair<std::__cxx11::string,cmCommand*>>
            ((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
              *)&this->ScriptedCommands,&local_120);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  ::~pair(&local_120);
  std::__cxx11::string::~string((string *)&oldCmd);
  return;
}

Assistant:

void cmState::AddScriptedCommand(std::string const& name, cmCommand* command)
{
  std::string sName = cmSystemTools::LowerCase(name);

  // if the command already exists, give a new name to the old command.
  if (cmCommand* oldCmd = this->GetCommand(sName)) {
    std::string const newName = "_" + sName;
    std::map<std::string, cmCommand*>::iterator pos =
      this->ScriptedCommands.find(newName);
    if (pos != this->ScriptedCommands.end()) {
      delete pos->second;
      this->ScriptedCommands.erase(pos);
    }
    this->ScriptedCommands.insert(std::make_pair(newName, oldCmd->Clone()));
  }

  // if the command already exists, free the old one
  std::map<std::string, cmCommand*>::iterator pos =
    this->ScriptedCommands.find(sName);
  if (pos != this->ScriptedCommands.end()) {
    delete pos->second;
    this->ScriptedCommands.erase(pos);
  }
  this->ScriptedCommands.insert(std::make_pair(sName, command));
}